

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O1

HTS_Boolean HTS_Engine_load(HTS_Engine *engine,char **voices,size_t num_voices)

{
  HTS_ModelSet *ms;
  bool bVar1;
  undefined4 uVar2;
  HTS_Boolean HVar3;
  int iVar4;
  size_t num;
  size_t sVar5;
  double *pdVar6;
  char *pcVar7;
  char *pcVar8;
  double **ppdVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  int iStack_44;
  long lVar17;
  
  HTS_Engine_clear(engine);
  ms = &engine->ms;
  HVar3 = HTS_ModelSet_load(ms,voices,num_voices);
  if (HVar3 == '\x01') {
    num = HTS_ModelSet_get_nstream(ms);
    sVar5 = HTS_ModelSet_get_sampling_frequency(ms);
    (engine->condition).sampling_frequency = sVar5;
    sVar5 = HTS_ModelSet_get_fperiod(ms);
    (engine->condition).fperiod = sVar5;
    pdVar6 = (double *)HTS_calloc(num,8);
    (engine->condition).msd_threshold = pdVar6;
    auVar21 = _DAT_0010dc00;
    if (num != 0) {
      lVar17 = num - 1;
      auVar12._8_4_ = (int)lVar17;
      auVar12._0_8_ = lVar17;
      auVar12._12_4_ = (int)((ulong)lVar17 >> 0x20);
      uVar10 = 0;
      auVar12 = auVar12 ^ _DAT_0010dc00;
      auVar18 = _DAT_0010dbf0;
      do {
        bVar1 = auVar12._0_4_ < SUB164(auVar18 ^ auVar21,0);
        iVar4 = auVar12._4_4_;
        iVar23 = SUB164(auVar18 ^ auVar21,4);
        if ((bool)(~(iVar4 < iVar23 || iVar23 == iVar4 && bVar1) & 1)) {
          pdVar6[uVar10] = 0.5;
        }
        if (iVar4 >= iVar23 && (iVar23 != iVar4 || !bVar1)) {
          pdVar6[uVar10 + 1] = 0.5;
        }
        uVar10 = uVar10 + 2;
        lVar17 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 2;
        auVar18._8_8_ = lVar17 + 2;
      } while ((num + 1 & 0xfffffffffffffffe) != uVar10);
    }
    local_58._4_4_ = (undefined4)(num_voices >> 0x20);
    uVar2 = local_58._4_4_;
    local_58 = (double)CONCAT44(0x43300000,(int)num_voices);
    uStack_50 = (double)CONCAT44(0x45300000,uVar2);
    pdVar6 = (double *)HTS_calloc(num,8);
    (engine->condition).gv_weight = pdVar6;
    auVar21 = _DAT_0010dc00;
    if (num != 0) {
      lVar17 = num - 1;
      auVar13._8_4_ = (int)lVar17;
      auVar13._0_8_ = lVar17;
      auVar13._12_4_ = (int)((ulong)lVar17 >> 0x20);
      uVar10 = 0;
      auVar13 = auVar13 ^ _DAT_0010dc00;
      auVar19 = _DAT_0010dbf0;
      do {
        bVar1 = auVar13._0_4_ < SUB164(auVar19 ^ auVar21,0);
        iVar4 = auVar13._4_4_;
        iVar23 = SUB164(auVar19 ^ auVar21,4);
        if ((bool)(~(iVar4 < iVar23 || iVar23 == iVar4 && bVar1) & 1)) {
          pdVar6[uVar10] = 1.0;
        }
        if (iVar4 >= iVar23 && (iVar23 != iVar4 || !bVar1)) {
          pdVar6[uVar10 + 1] = 1.0;
        }
        uVar10 = uVar10 + 2;
        lVar17 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 2;
        auVar19._8_8_ = lVar17 + 2;
      } while ((num + 1 & 0xfffffffffffffffe) != uVar10);
    }
    pcVar7 = HTS_ModelSet_get_option(ms,0);
    pcVar8 = strstr(pcVar7,"GAMMA=");
    if (pcVar8 != (char *)0x0) {
      iVar4 = atoi(pcVar8 + 6);
      (engine->condition).stage = (long)iVar4;
    }
    pcVar8 = strstr(pcVar7,"LN_GAIN=");
    if (pcVar8 != (char *)0x0) {
      iVar4 = atoi(pcVar8 + 8);
      (engine->condition).use_log_gain = iVar4 == 1;
    }
    pcVar7 = strstr(pcVar7,"ALPHA=");
    if (pcVar7 != (char *)0x0) {
      dVar11 = atof(pcVar7 + 6);
      (engine->condition).alpha = dVar11;
    }
    dVar11 = 1.0 / ((uStack_50 - 1.9342813113834067e+25) + (local_58 - 4503599627370496.0));
    pdVar6 = (double *)HTS_calloc(num_voices,8);
    (engine->condition).duration_iw = pdVar6;
    auVar21 = _DAT_0010dc00;
    if (num_voices != 0) {
      lVar17 = num_voices - 1;
      auVar14._8_4_ = (int)lVar17;
      auVar14._0_8_ = lVar17;
      auVar14._12_4_ = (int)((ulong)lVar17 >> 0x20);
      uVar10 = 0;
      auVar14 = auVar14 ^ _DAT_0010dc00;
      auVar20 = _DAT_0010dbf0;
      do {
        bVar1 = auVar14._0_4_ < SUB164(auVar20 ^ auVar21,0);
        iVar4 = auVar14._4_4_;
        iVar23 = SUB164(auVar20 ^ auVar21,4);
        if ((bool)(~(iVar4 < iVar23 || iVar23 == iVar4 && bVar1) & 1)) {
          pdVar6[uVar10] = dVar11;
        }
        if (iVar4 >= iVar23 && (iVar23 != iVar4 || !bVar1)) {
          pdVar6[uVar10 + 1] = dVar11;
        }
        uVar10 = uVar10 + 2;
        lVar17 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 2;
        auVar20._8_8_ = lVar17 + 2;
      } while ((num_voices + 1 & 0xfffffffffffffffe) != uVar10);
    }
    ppdVar9 = (double **)HTS_calloc(num_voices,8);
    (engine->condition).parameter_iw = ppdVar9;
    if (num_voices != 0) {
      lVar17 = num - 1;
      auVar21._8_4_ = (int)lVar17;
      auVar21._0_8_ = lVar17;
      auVar21._12_4_ = (int)((ulong)lVar17 >> 0x20);
      sVar5 = 0;
      auVar21 = auVar21 ^ _DAT_0010dc00;
      do {
        pdVar6 = (double *)HTS_calloc(num,8);
        auVar18 = _DAT_0010dc00;
        local_48 = auVar21._0_4_;
        iStack_44 = auVar21._4_4_;
        (engine->condition).parameter_iw[sVar5] = pdVar6;
        if (num != 0) {
          pdVar6 = (engine->condition).parameter_iw[sVar5];
          uVar10 = 0;
          auVar15 = _DAT_0010dbf0;
          do {
            bVar1 = local_48 < SUB164(auVar15 ^ auVar18,0);
            iVar4 = SUB164(auVar15 ^ auVar18,4);
            if ((bool)(~(iStack_44 < iVar4 || iVar4 == iStack_44 && bVar1) & 1)) {
              pdVar6[uVar10] = dVar11;
            }
            if (iStack_44 >= iVar4 && (iVar4 != iStack_44 || !bVar1)) {
              pdVar6[uVar10 + 1] = dVar11;
            }
            uVar10 = uVar10 + 2;
            lVar17 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 2;
            auVar15._8_8_ = lVar17 + 2;
          } while ((num + 1 & 0xfffffffffffffffe) != uVar10);
        }
        sVar5 = sVar5 + 1;
      } while (sVar5 != num_voices);
    }
    ppdVar9 = (double **)HTS_calloc(num_voices,8);
    (engine->condition).gv_iw = ppdVar9;
    HVar3 = '\x01';
    if (num_voices != 0) {
      lVar17 = num - 1;
      auVar22._8_4_ = (int)lVar17;
      auVar22._0_8_ = lVar17;
      auVar22._12_4_ = (int)((ulong)lVar17 >> 0x20);
      sVar5 = 0;
      auVar22 = auVar22 ^ _DAT_0010dc00;
      do {
        pdVar6 = (double *)HTS_calloc(num,8);
        auVar21 = _DAT_0010dc00;
        local_48 = auVar22._0_4_;
        iStack_44 = auVar22._4_4_;
        (engine->condition).gv_iw[sVar5] = pdVar6;
        if (num != 0) {
          pdVar6 = (engine->condition).gv_iw[sVar5];
          uVar10 = 0;
          auVar16 = _DAT_0010dbf0;
          do {
            bVar1 = local_48 < SUB164(auVar16 ^ auVar21,0);
            iVar4 = SUB164(auVar16 ^ auVar21,4);
            if ((bool)(~(iStack_44 < iVar4 || iVar4 == iStack_44 && bVar1) & 1)) {
              pdVar6[uVar10] = dVar11;
            }
            if (iStack_44 >= iVar4 && (iVar4 != iStack_44 || !bVar1)) {
              pdVar6[uVar10 + 1] = dVar11;
            }
            uVar10 = uVar10 + 2;
            lVar17 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 2;
            auVar16._8_8_ = lVar17 + 2;
          } while ((num + 1 & 0xfffffffffffffffe) != uVar10);
        }
        sVar5 = sVar5 + 1;
      } while (sVar5 != num_voices);
    }
  }
  else {
    HTS_Engine_clear(engine);
    HVar3 = '\0';
  }
  return HVar3;
}

Assistant:

HTS_Boolean HTS_Engine_load(HTS_Engine * engine, char **voices, size_t num_voices)
{
   size_t i, j;
   size_t nstream;
   double average_weight;
   const char *option, *find;

   /* reset engine */
   HTS_Engine_clear(engine);

   /* load voices */
   if (HTS_ModelSet_load(&engine->ms, voices, num_voices) != TRUE) {
      HTS_Engine_clear(engine);
      return FALSE;
   }
   nstream = HTS_ModelSet_get_nstream(&engine->ms);
   average_weight = 1.0 / num_voices;

   /* global */
   engine->condition.sampling_frequency = HTS_ModelSet_get_sampling_frequency(&engine->ms);
   engine->condition.fperiod = HTS_ModelSet_get_fperiod(&engine->ms);
   engine->condition.msd_threshold = (double *) HTS_calloc(nstream, sizeof(double));
   for (i = 0; i < nstream; i++)
      engine->condition.msd_threshold[i] = 0.5;
   engine->condition.gv_weight = (double *) HTS_calloc(nstream, sizeof(double));
   for (i = 0; i < nstream; i++)
      engine->condition.gv_weight[i] = 1.0;

   /* spectrum */
   option = HTS_ModelSet_get_option(&engine->ms, 0);
   find = strstr(option, "GAMMA=");
   if (find != NULL)
      engine->condition.stage = (size_t) atoi(&find[strlen("GAMMA=")]);
   find = strstr(option, "LN_GAIN=");
   if (find != NULL)
      engine->condition.use_log_gain = atoi(&find[strlen("LN_GAIN=")]) == 1 ? TRUE : FALSE;
   find = strstr(option, "ALPHA=");
   if (find != NULL)
      engine->condition.alpha = atof(&find[strlen("ALPHA=")]);

   /* interpolation weights */
   engine->condition.duration_iw = (double *) HTS_calloc(num_voices, sizeof(double));
   for (i = 0; i < num_voices; i++)
      engine->condition.duration_iw[i] = average_weight;
   engine->condition.parameter_iw = (double **) HTS_calloc(num_voices, sizeof(double *));
   for (i = 0; i < num_voices; i++) {
      engine->condition.parameter_iw[i] = (double *) HTS_calloc(nstream, sizeof(double));
      for (j = 0; j < nstream; j++)
         engine->condition.parameter_iw[i][j] = average_weight;
   }
   engine->condition.gv_iw = (double **) HTS_calloc(num_voices, sizeof(double *));
   for (i = 0; i < num_voices; i++) {
      engine->condition.gv_iw[i] = (double *) HTS_calloc(nstream, sizeof(double));
      for (j = 0; j < nstream; j++)
         engine->condition.gv_iw[i][j] = average_weight;
   }

   return TRUE;
}